

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCodeEditor_UNIX.cxx
# Opt level: O2

int __thiscall ExternalCodeEditor::open_editor(ExternalCodeEditor *this,char *editor_cmd,char *code)

{
  int iVar1;
  pid_t pVar2;
  int iVar3;
  char *pcVar4;
  int *piVar5;
  size_t __n;
  size_t sVar6;
  char *pcVar7;
  char *fmt;
  stat sbuf;
  
  pcVar4 = this->filename_;
  iVar3 = -1;
  if (pcVar4 == (char *)0x0) {
    pcVar4 = tmp_filename(this);
    set_filename(this,pcVar4);
    pcVar4 = this->filename_;
    if (pcVar4 == (char *)0x0) {
      return -1;
    }
  }
  iVar1 = is_file(pcVar4);
  if ((iVar1 != 0) && (this->pid_ != -1)) {
    pVar2 = reap_editor(this);
    if (pVar2 == 0) {
      pcVar4 = this->filename_;
      pcVar7 = (char *)(long)this->pid_;
      fmt = "Editor Already Open\n  file=\'%s\'\n  pid=%ld";
      iVar3 = 0;
      goto LAB_0018394f;
    }
    if (pVar2 == -1) {
      piVar5 = __errno_location();
      pcVar4 = strerror(*piVar5);
      fl_alert("ERROR: waitpid() failed: %s\nfile=\'%s\', pid=%ld",pcVar4,this->filename_,
               (long)this->pid_);
      return -1;
    }
    if (G_debug != 0) {
      printf("*** REAPED EXTERNAL EDITOR: PID %ld\n",(long)pVar2);
    }
    pcVar4 = tmp_filename(this);
    set_filename(this,pcVar4);
  }
  pcVar4 = this->filename_;
  iVar1 = open64(pcVar4,0x41,0x1b6);
  if (iVar1 != -1) {
    __n = strlen(code);
    sVar6 = write(iVar1,code,__n);
    if (sVar6 == 0xffffffffffffffff) {
      piVar5 = __errno_location();
      pcVar7 = strerror(*piVar5);
      fl_alert("ERROR: write() \'%s\': %s",pcVar4,pcVar7);
    }
    else {
      if (sVar6 == __n) {
        close(iVar1);
        iVar3 = stat64(this->filename_,(stat64 *)&sbuf);
        if (iVar3 < 0) {
          pcVar4 = this->filename_;
          piVar5 = __errno_location();
          pcVar7 = strerror(*piVar5);
          fl_alert("ERROR: can\'t stat(\'%s\'): %s",pcVar4,pcVar7);
          return -1;
        }
        this->file_mtime_ = sbuf.st_mtim.tv_sec;
        this->file_size_ = sbuf.st_size;
        iVar3 = start_editor(this,editor_cmd,this->filename_);
        if (-1 < iVar3) {
          return 0;
        }
        if (G_debug == 0) {
          return -1;
        }
        puts("Editor failed to start");
        return -1;
      }
      fl_alert("ERROR: write() \'%s\': wrote only %lu bytes, expected %lu",pcVar4,sVar6,__n);
    }
    close(iVar1);
    return -1;
  }
  piVar5 = __errno_location();
  pcVar7 = strerror(*piVar5);
  fmt = "ERROR: open() \'%s\': %s";
LAB_0018394f:
  fl_alert(fmt,pcVar4,pcVar7);
  return iVar3;
}

Assistant:

int ExternalCodeEditor::open_editor(const char *editor_cmd,
                                    const char *code) {
  // Make sure a temp filename exists
  if ( !filename() ) {
    set_filename(tmp_filename());
    if ( !filename() ) return -1;
  }
  // See if tmpfile already exists or editor already open
  if ( is_file(filename()) ) {
    if ( is_editing() ) {
      // See if editor recently closed but not reaped; try to reap
      pid_t wpid = reap_editor();
      switch (wpid) {
        case -1:        // waitpid() failed
          fl_alert("ERROR: waitpid() failed: %s\nfile='%s', pid=%ld",
            strerror(errno), filename(), (long)pid_);
          return -1;
        case 0:         // process still running
          fl_alert("Editor Already Open\n  file='%s'\n  pid=%ld",
            filename(), (long)pid_);
          return 0;
        default:        // process reaped, wpid is pid reaped
          if ( G_debug )
            printf("*** REAPED EXTERNAL EDITOR: PID %ld\n", (long)wpid);
          break;        // fall thru to open new editor instance
      }
      // Reinstate tmp filename (reap_editor() clears it)
      set_filename(tmp_filename());
    }
  }
  if ( save_file(filename(), code) < 0 ) {
    return -1;  // errors were shown in dialog
  }
  // Update mtime/size from closed file
  struct stat sbuf;
  if ( stat(filename(), &sbuf) < 0 ) {
    fl_alert("ERROR: can't stat('%s'): %s", filename(), strerror(errno));
    return -1;
  }
  file_mtime_ = sbuf.st_mtime;
  file_size_  = sbuf.st_size;
  if ( start_editor(editor_cmd, filename()) < 0 ) { // open file in external editor
    if ( G_debug ) printf("Editor failed to start\n");
    return -1;  // errors were shown in dialog
  }
  return 0;
}